

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::CropLayerParams::SerializeWithCachedSizes
          (CropLayerParams *this,CodedOutputStream *output)

{
  uint64 value;
  int index;
  int iVar1;
  
  if (this->cropamounts_ != (BorderAmounts *)0x0 &&
      this != (CropLayerParams *)&_CropLayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&this->cropamounts_->super_MessageLite,output);
  }
  iVar1 = (this->offset_).current_size_;
  if (0 < iVar1) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,0x2a);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_offset_cached_byte_size_);
    iVar1 = (this->offset_).current_size_;
  }
  index = 0;
  if (iVar1 < 1) {
    iVar1 = 0;
    index = 0;
  }
  for (; iVar1 != index; index = index + 1) {
    value = offset(this,index);
    google::protobuf::io::CodedOutputStream::WriteVarint64(output,value);
  }
  return;
}

Assistant:

void CropLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.CropLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.BorderAmounts cropAmounts = 1;
  if (this->has_cropamounts()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *this->cropamounts_, output);
  }

  // repeated uint64 offset = 5;
  if (this->offset_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(5, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_offset_cached_byte_size_);
  }
  for (int i = 0, n = this->offset_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->offset(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.CropLayerParams)
}